

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsigc++.h
# Opt level: O0

intrusive_ptr<sigc::functorn_2<void,_unsigned_int,_bool,_int,_void_*>_> __thiscall
sigc::functorn_2<void,_unsigned_int,_bool,_int,_void_*>::create
          (functorn_2<void,_unsigned_int,_bool,_int,_void_*> *this,functor_t *fb,uint _a1,bool _a2)

{
  functorn_2<void,_unsigned_int,_bool,_int,_void_*> *this_00;
  bool _a2_local;
  uint _a1_local;
  functor_t *fb_local;
  
  this_00 = (functorn_2<void,_unsigned_int,_bool,_int,_void_*> *)operator_new(0x20);
  functorn_2(this_00,fb,_a1,_a2);
  boost::intrusive_ptr<sigc::functorn_2<void,_unsigned_int,_bool,_int,_void_*>_>::intrusive_ptr
            ((intrusive_ptr<sigc::functorn_2<void,_unsigned_int,_bool,_int,_void_*>_> *)this,this_00
             ,true);
  return (intrusive_ptr<sigc::functorn_2<void,_unsigned_int,_bool,_int,_void_*>_>)this;
}

Assistant:

static boost::intrusive_ptr<functorn_2> create(const functor_t &fb, A1 _a1, A2 _a2) {
        return new functorn_2(fb, _a1, _a2);
    }